

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O0

void Acec_StatsCollect(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  word wVar4;
  int *piVar5;
  long lVar6;
  Gia_Obj_t *pObj;
  uint local_460;
  int Class;
  int k;
  int i;
  int iLut;
  int iFan;
  int iTruthF;
  int iTruth;
  word TruthF;
  word Truth;
  Vec_Wrd_t *vTemp;
  Vec_Wrd_t *vTruths;
  int Map [256];
  char **pNames;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  ppcVar3 = Kit_DsdNpn4ClassNames();
  memset(&vTruths,0,0x400);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_WrdStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_WrdStart(iVar1);
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                  ,0x165,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManLutSizeMax(p);
  if (iVar1 < 4) {
    for (k = 1; iVar1 = Gia_ManObjNum(p), k < iVar1; k = k + 1) {
      iVar1 = Gia_ObjIsLut(p,k);
      if (iVar1 != 0) {
        wVar4 = Gia_ObjComputeTruthTable6Lut(p,k,p_01);
        Vec_WrdWriteEntry(p_00,k,wVar4);
      }
    }
    Vec_WrdFree(p_01);
    for (k = 1; iVar1 = Gia_ManObjNum(p), k < iVar1; k = k + 1) {
      iVar1 = Gia_ObjIsLut(p,k);
      if (iVar1 != 0) {
        wVar4 = Vec_WrdEntry(p_00,k);
        iVar1 = Npn3Table[wVar4 & 0xff][1];
        if (0xe < iVar1) {
          __assert_fail("iTruth < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                        ,0x173,"void Acec_StatsCollect(Gia_Man_t *, int)");
        }
        for (local_460 = 0; iVar2 = Gia_ObjLutSize(p,k), (int)local_460 < iVar2;
            local_460 = local_460 + 1) {
          piVar5 = Gia_ObjLutFanins(p,k);
          wVar4 = Vec_WrdEntry(p_00,piVar5[(int)local_460]);
          if (0xe < Npn3Table[wVar4 & 0xff][1]) {
            __assert_fail("iTruthF < 15",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                          ,0x178,"void Acec_StatsCollect(Gia_Man_t *, int)");
          }
          lVar6 = (long)(Npn3Table[wVar4 & 0xff][1] * 0x10 + iVar1);
          Map[lVar6 + -2] = Map[lVar6 + -2] + 1;
        }
      }
    }
    for (local_460 = 0; iVar1 = Vec_IntSize(p->vCos), (int)local_460 < iVar1;
        local_460 = local_460 + 1) {
      pObj = Gia_ManCo(p,local_460);
      iVar1 = Gia_ObjFaninId0p(p,pObj);
      wVar4 = Vec_WrdEntry(p_00,iVar1);
      if (0xe < Npn3Table[wVar4 & 0xff][1]) {
        __assert_fail("iTruthF < 15",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                      ,0x180,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
      lVar6 = (long)(Npn3Table[wVar4 & 0xff][1] << 4);
      Map[lVar6 + -2] = Map[lVar6 + -2] + 1;
    }
    Vec_WrdFree(p_00);
    printf("fi / fo");
    for (Class = 0; Class < 0xe; Class = Class + 1) {
      printf("%6d ",(ulong)(uint)Class);
    }
    printf("\n");
    for (Class = 0; Class < 0xe; Class = Class + 1) {
      printf("%6d ",(ulong)(uint)Class);
      for (local_460 = 0; (int)local_460 < 0xe; local_460 = local_460 + 1) {
        if (Map[(long)(int)(Class << 4 | local_460) + -2] == 0) {
          printf("%6s ",".");
        }
        else {
          printf("%6d ",(ulong)(uint)Map[(long)(int)(Class << 4 | local_460) + -2]);
        }
      }
      printf("\n");
    }
    printf("\nClasses:\n");
    Class = 0;
    while( true ) {
      if (0xd < Class) {
        return;
      }
      local_460 = 0;
      while (((int)local_460 < 0x100 && (Npn3Table[(int)local_460][1] != Class))) {
        local_460 = local_460 + 1;
      }
      if (0xff < (int)local_460) break;
      iVar1 = Dar_LibReturnClass(Npn3Table[(int)local_460][0] << 8 | Npn3Table[(int)local_460][0]);
      printf("%2d : %s\n",(ulong)(uint)Class,ppcVar3[iVar1]);
      Class = Class + 1;
    }
    __assert_fail("k < 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                  ,0x19a,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  __assert_fail("Gia_ManLutSizeMax(p) < 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecSt.c"
                ,0x166,"void Acec_StatsCollect(Gia_Man_t *, int)");
}

Assistant:

void Acec_StatsCollect( Gia_Man_t * p, int fVerbose )
{
    extern int Dar_LibReturnClass( unsigned uTruth );
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();

    int Map[256] = {0};
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    word Truth, TruthF;
    int iTruth, iTruthF;
    int iFan, iLut, i, k, Class;
    assert( Gia_ManHasMapping(p) );
    assert( Gia_ManLutSizeMax(p) < 4 );
    // collect truth tables
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Gia_ObjComputeTruthTable6Lut( p, iLut, vTemp );
        Vec_WrdWriteEntry( vTruths, iLut, Truth );
    }
    Vec_WrdFree( vTemp );
    // collect pairs
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Vec_WrdEntry( vTruths, iLut ) & 0xFF;
        iTruth = Npn3Table[Truth][1];
        assert( iTruth < 15 );
        Gia_LutForEachFanin( p, iLut, iFan, k )
        {
            TruthF = Vec_WrdEntry( vTruths, iFan ) & 0xFF;
            iTruthF = Npn3Table[TruthF][1];
            assert( iTruthF < 15 );
            Map[(iTruthF << 4) + iTruth]++;
        }
    }
    Gia_ManForEachCoDriverId( p, iFan, k )
    {
        TruthF = Vec_WrdEntry( vTruths, iFan );
        iTruthF = Npn3Table[TruthF & 0xFF][1];
        assert( iTruthF < 15 );
        Map[(iTruthF << 4)]++;
    }
    Vec_WrdFree( vTruths );
    // print statistics
    printf( "fi / fo" );
    for ( i = 0; i < 14; i++ )
        printf( "%6d ", i );
    printf( "\n" );
    for ( i = 0; i < 14; i++ )
    {
        printf( "%6d ", i );
        for ( k = 0; k < 14; k++ )
            if ( Map[(i << 4) | k] )
                printf( "%6d ", Map[(i << 4) | k] );
            else
                printf( "%6s ", "." );
        printf( "\n" );
    }
    // print class formulas
    printf( "\nClasses:\n" );
    for ( i = 0; i < 14; i++ )
    {
        for ( k = 0; k < 256; k++ )
            if ( Npn3Table[k][1] == i )
                break;
        assert( k < 256 );
        Class = Dar_LibReturnClass( (Npn3Table[k][0] << 8) | Npn3Table[k][0] );
        printf( "%2d : %s\n", i, pNames[Class] );
    }
}